

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

void core::image::save_file(ConstPtr *image,string *filename)

{
  Exception *this;
  bool bVar1;
  allocator local_111;
  string local_110 [32];
  shared_ptr<const_core::Image<unsigned_char>_> local_f0;
  shared_ptr<const_core::Image<unsigned_char>_> local_e0;
  shared_ptr<const_core::Image<unsigned_char>_> local_d0;
  undefined4 local_bc;
  shared_ptr<const_core::Image<unsigned_char>_> local_b8;
  string local_a8 [32];
  string local_88 [8];
  string fext5;
  string local_58 [32];
  string local_38 [8];
  string fext4;
  string *filename_local;
  ConstPtr *image_local;
  
  util::string::right(local_58,filename,4);
  util::string::lowercase(local_38,(string *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  util::string::right(local_a8,filename,5);
  util::string::lowercase(local_88,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,".jpg");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88,".jpeg");
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,".png");
      if (bVar1) {
        std::shared_ptr<const_core::Image<unsigned_char>_>::shared_ptr(&local_d0,image);
        save_png_file(&local_d0,filename,1);
        std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr(&local_d0);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,".tif");
        if (!bVar1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_88,".tiff");
          if (!bVar1) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_38,".ppm");
            if (!bVar1) {
              this = (Exception *)__cxa_allocate_exception(0x28);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_110,"Output filetype not supported",&local_111);
              util::Exception::Exception(this,(string *)local_110);
              __cxa_throw(this,&util::Exception::typeinfo,util::Exception::~Exception);
            }
            std::shared_ptr<const_core::Image<unsigned_char>_>::shared_ptr(&local_f0,image);
            save_ppm_file(&local_f0,filename);
            std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr(&local_f0);
            goto LAB_0011ebcc;
          }
        }
        std::shared_ptr<const_core::Image<unsigned_char>_>::shared_ptr(&local_e0,image);
        save_tiff_file(&local_e0,filename);
        std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr(&local_e0);
      }
      goto LAB_0011ebcc;
    }
  }
  std::shared_ptr<const_core::Image<unsigned_char>_>::shared_ptr(&local_b8,image);
  save_jpg_file(&local_b8,filename,0x55);
  std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr(&local_b8);
LAB_0011ebcc:
  local_bc = 1;
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void
save_file (ByteImage::ConstPtr image, std::string const& filename)
{
    using namespace util::string;
    std::string fext4 = lowercase(right(filename, 4));
    std::string fext5 = lowercase(right(filename, 5));

#ifndef MVE_NO_JPEG_SUPPORT
    if (fext4 == ".jpg" || fext5 == ".jpeg")
    {
        save_jpg_file(image, filename, 85);
        return;
    }
#endif

#ifndef MVE_NO_PNG_SUPPORT
    if (fext4 == ".png")
    {
        save_png_file(image, filename);
        return;
    }
#endif

#ifndef MVE_NO_TIFF_SUPPORT
    if (fext4 == ".tif" || fext5 == ".tiff")
    {
        save_tiff_file(image, filename);
        return;
    }
#endif

    if (fext4 == ".ppm")
    {
        save_ppm_file(image, filename);
        return;
    }

    throw util::Exception("Output filetype not supported");
}